

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_op_load_fpr_QT1(TCGContext_conflict8 *tcg_ctx,uint src)

{
  tcg_gen_op3_sparc64(tcg_ctx,INDEX_op_st_i64,
                      (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_fpr[src >> 1]),
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0x1b30);
  tcg_gen_op3_sparc64(tcg_ctx,INDEX_op_st_i64,
                      (TCGArg)((long)&tcg_ctx->pool_cur +
                              (long)tcg_ctx->cpu_fpr[(ulong)(src >> 1) + 1]),
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0x1b28);
  return;
}

Assistant:

static void gen_op_load_fpr_QT1(TCGContext *tcg_ctx, unsigned int src)
{
    tcg_gen_st_i64(tcg_ctx, tcg_ctx->cpu_fpr[src / 2], tcg_ctx->cpu_env, offsetof(CPUSPARCState, qt1) +
                   offsetof(CPU_QuadU, ll.upper));
    tcg_gen_st_i64(tcg_ctx, tcg_ctx->cpu_fpr[src/2 + 1], tcg_ctx->cpu_env, offsetof(CPUSPARCState, qt1) +
                   offsetof(CPU_QuadU, ll.lower));
}